

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

QColorTrcLut * __thiscall
QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate *this)

{
  QColorTrcLut *pQVar1;
  
  pQVar1 = colorProfileForA32Text(this);
  return pQVar1;
}

Assistant:

const QColorTrcLut *QGuiApplicationPrivate::colorProfileForA8Text()
{
#ifdef Q_OS_WIN
    if (!m_a8ColorProfile)
        m_a8ColorProfile = QColorTrcLut::fromGamma(2.31f); // This is a hard-coded thing for Windows text rendering
    return m_a8ColorProfile.get();
#else
    return colorProfileForA32Text();
#endif
}